

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageViewTests.cpp
# Opt level: O0

string * __thiscall
vkt::pipeline::(anonymous_namespace)::getComponentMappingCaseName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          VkComponentMapping *componentMapping)

{
  ostream *poVar1;
  VkComponentSwizzle componentSwizzle;
  VkComponentSwizzle componentSwizzle_00;
  VkComponentSwizzle componentSwizzle_01;
  VkComponentSwizzle componentSwizzle_02;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1b0;
  ostringstream local_190 [8];
  ostringstream name;
  VkComponentMapping *componentMapping_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  getComponentSwizzleCaseName_abi_cxx11_
            (&local_1b0,(_anonymous_namespace_ *)(ulong)*(uint *)this,componentSwizzle);
  poVar1 = std::operator<<((ostream *)local_190,(string *)&local_1b0);
  poVar1 = std::operator<<(poVar1,"_");
  getComponentSwizzleCaseName_abi_cxx11_
            (&local_1e0,(_anonymous_namespace_ *)(ulong)*(uint *)(this + 4),componentSwizzle_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  poVar1 = std::operator<<(poVar1,"_");
  getComponentSwizzleCaseName_abi_cxx11_
            (&local_200,(_anonymous_namespace_ *)(ulong)*(uint *)(this + 8),componentSwizzle_01);
  poVar1 = std::operator<<(poVar1,(string *)&local_200);
  poVar1 = std::operator<<(poVar1,"_");
  getComponentSwizzleCaseName_abi_cxx11_
            (&local_220,(_anonymous_namespace_ *)(ulong)*(uint *)(this + 0xc),componentSwizzle_02);
  std::operator<<(poVar1,(string *)&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

static std::string getComponentMappingCaseName (const VkComponentMapping& componentMapping)
{
	std::ostringstream name;

	name << getComponentSwizzleCaseName(componentMapping.r) << "_"
		 << getComponentSwizzleCaseName(componentMapping.g) << "_"
		 << getComponentSwizzleCaseName(componentMapping.b) << "_"
		 << getComponentSwizzleCaseName(componentMapping.a);

	return name.str();
}